

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *eps2,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RSI;
  long in_RDI;
  int *in_R9;
  uint *in_stack_00000008;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000010;
  cpp_dec_float<100U,_int,_void> *in_stack_00000030;
  cpp_dec_float<100U,_int,_void> *in_stack_00000038;
  long in_stack_00000040;
  uint *in_stack_00000048;
  int *in_stack_00000050;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000110;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000138;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000140;
  int *in_stack_00000148;
  int *in_stack_00000150;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000158;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000160;
  int *in_stack_00000400;
  int *in_stack_00000408;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_00000410;
  int *it;
  int *rperm;
  int k;
  int j;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff958;
  cpp_dec_float<100U,_int,_void> *pcVar5;
  cpp_dec_float<100U,_int,_void> *in_stack_fffffffffffff960;
  cpp_dec_float<100U,_int,_void> *this_00;
  cpp_dec_float<100U,_int,_void> local_51c;
  cpp_dec_float<100U,_int,_void> local_4cc;
  undefined4 local_47c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffbf0;
  int in_stack_fffffffffffffbfc;
  int *in_stack_fffffffffffffc00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffc08;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc10;
  int *local_290;
  uint local_278;
  int local_274;
  int in_stack_fffffffffffffe4c;
  int *in_stack_fffffffffffffe50;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe58;
  int *in_stack_fffffffffffffe60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffe68;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe70;
  
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  pcVar5 = in_stack_00000030;
  this_00 = in_stack_00000038;
  vSolveLright2(in_stack_00000160,in_stack_00000158,in_stack_00000150,in_stack_00000148,
                in_stack_00000140,in_stack_00000138,in_stack_00000400,in_stack_00000408,
                in_stack_00000410);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00);
  lVar2 = *(long *)(in_RDI + 0x1a8);
  if (in_stack_00000040 == 0) {
    local_278 = 0;
    for (local_274 = 0; local_274 < (int)*in_stack_00000008; local_274 = local_274 + 1) {
      iVar1 = in_R9[local_274];
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,pcVar5);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_00000010,in_RSI);
      if (bVar3) {
        enQueueMax(in_R9,(int *)&local_278,*(int *)(lVar2 + (long)iVar1 * 4));
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar5);
      }
    }
    *in_stack_00000008 = local_278;
  }
  else {
    local_290 = in_stack_00000050;
    local_278 = 0;
    for (local_274 = 0; local_274 < (int)*in_stack_00000008; local_274 = local_274 + 1) {
      iVar1 = in_R9[local_274];
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,pcVar5);
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5)
      ;
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_00000010,in_RSI);
      if (bVar3) {
        *local_290 = iVar1;
        enQueueMax(in_R9,(int *)&local_278,*(int *)(lVar2 + (long)iVar1 * 4));
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,pcVar5);
        local_290 = local_290 + 1;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  (this_00,(long_long_type)pcVar5);
      }
    }
    *in_stack_00000008 = local_278;
    *in_stack_00000048 = local_278;
  }
  local_278 = 0;
  for (local_274 = 0; local_274 < (int)(in_stack_00000038->data)._M_elems[0];
      local_274 = local_274 + 1) {
    uVar4 = (in_stack_00000030->data)._M_elems[local_274];
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=(this_00,pcVar5);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (in_stack_00000010,in_RSI);
    if (bVar3) {
      enQueueMax((int *)in_stack_00000030,(int *)&local_278,*(int *)(lVar2 + (long)(int)uVar4 * 4));
    }
    else {
      local_47c = 0;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (this_00,(long_long_type)pcVar5);
    }
  }
  (in_stack_00000038->data)._M_elems[0] = local_278;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
  pcVar5 = &local_4cc;
  uVar4 = vSolveUright(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60
                       ,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                       in_stack_fffffffffffffe4c,in_stack_00000110);
  *in_stack_00000008 = uVar4;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
  pcVar5 = &local_51c;
  uVar4 = vSolveUright(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60
                       ,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                       in_stack_fffffffffffffe4c,in_stack_00000110);
  (in_stack_00000038->data)._M_elems[0] = uVar4;
  if (*(int *)(in_RDI + 0x208) == 0) {
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    uVar4 = vSolveUpdateRight(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                              in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
                              in_stack_fffffffffffffbf0);
    *in_stack_00000008 = uVar4;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float(this_00,pcVar5);
    uVar4 = vSolveUpdateRight(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                              in_stack_fffffffffffffc00,in_stack_fffffffffffffbfc,
                              in_stack_fffffffffffffbf0);
    (in_stack_00000038->data)._M_elems[0] = uVar4;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update2sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R* forest, int* forestNum, int* forestIdx)
{
   /* solve with L */
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap for both ridx and ridx2 */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   /* solve with U */
   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
   }
}